

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void __thiscall FBehavior::LoadScriptsDirectory(FBehavior *this)

{
  uint uVar1;
  BYTE *pBVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  BYTE *pBVar7;
  ulong *puVar8;
  undefined1 *puVar9;
  undefined8 *puVar10;
  ScriptPtr *pSVar11;
  ulong uVar12;
  int iVar13;
  size_t __nmemb;
  long lVar14;
  DWORD *chunk_1;
  long lVar15;
  BYTE *chunk;
  int *piVar16;
  ulong uVar17;
  int *piVar18;
  WORD *pWVar19;
  FString local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  this->NumScripts = 0;
  this->Scripts = (ScriptPtr *)0x0;
  if (this->Format - ACS_Enhanced < 2) {
    piVar16 = (int *)this->Chunks;
    if (piVar16 != (int *)0x0) {
      for (; piVar16 < this->Data + this->DataSize;
          piVar16 = (int *)((long)piVar16 + (ulong)(piVar16[1] + 8))) {
        if (*piVar16 == 0x52545053) goto LAB_004d4981;
      }
    }
    piVar16 = (int *)0x0;
LAB_004d4981:
    if (piVar16 != (int *)0x0) {
      uVar1 = piVar16[1];
      if (*(int *)this->Data == 0x534341) {
        uVar17 = (ulong)(uVar1 >> 3);
        this->NumScripts = uVar1 >> 3;
        puVar8 = (ulong *)operator_new__(uVar17 * 0x38 + 8);
        *puVar8 = uVar17;
        if (7 < uVar1) {
          lVar14 = 0;
          do {
            *(undefined4 *)((long)puVar8 + lVar14 + 0x18) = 0;
            puVar10 = (undefined8 *)((long)puVar8 + lVar14 + 0x20);
            *puVar10 = 0;
            puVar10[1] = 0;
            *(undefined4 *)((long)puVar8 + lVar14 + 0x30) = 0;
            *(undefined8 *)((long)puVar8 + lVar14 + 0x34) = 0xffffffff;
            lVar14 = lVar14 + 0x38;
          } while (uVar17 * 0x38 - lVar14 != 0);
        }
        this->Scripts = (ScriptPtr *)(puVar8 + 1);
        if (7 < uVar1) {
          puVar9 = (undefined1 *)((long)puVar8 + 0x11);
          uVar12 = 0;
          do {
            *(int *)(puVar9 + -9) = (int)(short)piVar16[uVar12 * 2 + 2];
            puVar9[-1] = *(undefined1 *)((long)piVar16 + uVar12 * 8 + 10);
            *puVar9 = *(undefined1 *)((long)piVar16 + uVar12 * 8 + 0xb);
            *(int *)(puVar9 + -5) = piVar16[uVar12 * 2 + 3];
            uVar12 = uVar12 + 1;
            puVar9 = puVar9 + 0x38;
          } while (uVar17 != uVar12);
        }
      }
      else {
        this->NumScripts = uVar1 / 0xc;
        lVar14 = ((ulong)uVar1 / 0xc) * 0x38;
        puVar8 = (ulong *)operator_new__(lVar14 + 8);
        *puVar8 = (ulong)uVar1 / 0xc;
        if (0xb < uVar1) {
          lVar15 = 0;
          do {
            *(undefined4 *)((long)puVar8 + lVar15 + 0x18) = 0;
            puVar10 = (undefined8 *)((long)puVar8 + lVar15 + 0x20);
            *puVar10 = 0;
            puVar10[1] = 0;
            *(undefined4 *)((long)puVar8 + lVar15 + 0x30) = 0;
            *(undefined8 *)((long)puVar8 + lVar15 + 0x34) = 0xffffffff;
            lVar15 = lVar15 + 0x38;
          } while (lVar14 - lVar15 != 0);
        }
        this->Scripts = (ScriptPtr *)(puVar8 + 1);
        if (0xb < uVar1) {
          puVar9 = (undefined1 *)((long)puVar8 + 0x11);
          lVar14 = 0;
          do {
            *(int *)(puVar9 + -9) = (int)*(short *)((long)piVar16 + lVar14 + 8);
            puVar9[-1] = *(undefined1 *)((long)piVar16 + lVar14 + 10);
            *puVar9 = *(undefined1 *)((long)piVar16 + lVar14 + 0x10);
            *(undefined4 *)(puVar9 + -5) = *(undefined4 *)((long)piVar16 + lVar14 + 0xc);
            puVar9 = puVar9 + 0x38;
            lVar14 = lVar14 + 0xc;
          } while ((ulong)(uVar1 / 0xc << 2) * 3 != lVar14);
        }
      }
    }
  }
  else if (this->Format == ACS_Old) {
    pBVar2 = this->Data;
    uVar17 = (ulong)*(uint *)(pBVar2 + 4);
    iVar13 = *(int *)(pBVar2 + uVar17);
    uVar12 = (ulong)iVar13;
    this->NumScripts = iVar13;
    if (uVar12 != 0) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar12;
      uVar5 = SUB168(auVar4 * ZEXT816(0x38),0);
      uVar6 = uVar5 + 8;
      if (0xfffffffffffffff7 < uVar5) {
        uVar6 = 0xffffffffffffffff;
      }
      uVar5 = 0xffffffffffffffff;
      if (SUB168(auVar4 * ZEXT816(0x38),8) == 0) {
        uVar5 = uVar6;
      }
      puVar8 = (ulong *)operator_new__(uVar5);
      *puVar8 = uVar12;
      lVar14 = 0;
      do {
        *(undefined4 *)((long)puVar8 + lVar14 + 0x18) = 0;
        puVar10 = (undefined8 *)((long)puVar8 + lVar14 + 0x20);
        *puVar10 = 0;
        puVar10[1] = 0;
        *(undefined4 *)((long)puVar8 + lVar14 + 0x30) = 0;
        *(undefined8 *)((long)puVar8 + lVar14 + 0x34) = 0xffffffff;
        lVar14 = lVar14 + 0x38;
      } while (uVar12 * 0x38 - lVar14 != 0);
      this->Scripts = (ScriptPtr *)(puVar8 + 1);
      if (0 < iVar13) {
        pBVar7 = (BYTE *)((long)puVar8 + 0x11);
        lVar14 = 0;
        do {
          uVar1 = *(uint *)(pBVar2 + lVar14 + uVar17 + 4);
          *(uint *)(pBVar7 + -9) = uVar1 % 1000;
          pBVar7[-1] = (BYTE)(uVar1 / 1000);
          *pBVar7 = pBVar2[lVar14 + uVar17 + 0xc];
          *(undefined4 *)(pBVar7 + -5) = *(undefined4 *)(pBVar2 + lVar14 + uVar17 + 8);
          pBVar7 = pBVar7 + 0x38;
          lVar14 = lVar14 + 0xc;
        } while (uVar12 * 0xc != lVar14);
      }
    }
  }
  iVar13 = this->NumScripts;
  __nmemb = (size_t)iVar13;
  if (0 < (long)__nmemb) {
    pSVar11 = this->Scripts;
    lVar14 = 0;
    do {
      *(undefined4 *)((long)&pSVar11->VarCount + lVar14) = 0x14;
      lVar14 = lVar14 + 0x38;
    } while (__nmemb * 0x38 - lVar14 != 0);
  }
  if (((1 < iVar13) && (qsort(this->Scripts,__nmemb,0x38,SortScripts), this->Format == ACS_Old)) &&
     (1 < this->NumScripts)) {
    lVar14 = 0;
    lVar15 = 0;
    do {
      if (*(int *)((long)&this->Scripts->Number + lVar14) ==
          *(int *)((long)&this->Scripts[1].Number + lVar14)) {
        ScriptPresentation((int)&local_68);
        Printf("\x1cI%s appears more than once.\n",local_68.Chars);
        FString::~FString(&local_68);
        if ((&this->Scripts[1].Type)[lVar14] == '\0') {
          puVar10 = (undefined8 *)((long)&this->Scripts->Number + lVar14);
          local_68.Chars = (char *)*puVar10;
          uStack_60 = puVar10[1];
          local_58 = puVar10[2];
          pvVar3 = (void *)puVar10[3];
          local_38 = puVar10[6];
          local_48 = puVar10[4];
          uStack_40 = puVar10[5];
          puVar10[6] = puVar10[0xd];
          puVar10[4] = puVar10[0xb];
          puVar10[5] = puVar10[0xc];
          puVar10[2] = puVar10[9];
          puVar10[3] = puVar10[10];
          *puVar10 = puVar10[7];
          puVar10[1] = puVar10[8];
          puVar10[7] = local_68.Chars;
          puVar10[8] = uStack_60;
          puVar10[9] = local_58;
          puVar10[10] = pvVar3;
          puVar10[0xb] = local_48;
          puVar10[0xc] = uStack_40;
          puVar10[0xd] = local_38;
          if (pvVar3 != (void *)0x0) {
            operator_delete__(pvVar3);
          }
        }
      }
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + 0x38;
    } while (lVar15 < (long)this->NumScripts + -1);
  }
  if (this->Format != ACS_Old) {
    piVar16 = (int *)this->Chunks;
    if (piVar16 != (int *)0x0) {
      for (piVar18 = piVar16; piVar18 < this->Data + this->DataSize;
          piVar18 = (int *)((long)piVar18 + (ulong)(piVar18[1] + 8))) {
        if (*piVar18 == 0x474c4653) goto LAB_004d4c8a;
      }
    }
    piVar18 = (int *)0x0;
LAB_004d4c8a:
    if ((piVar18 != (int *)0x0) && (3 < (uint)piVar18[1])) {
      pWVar19 = (WORD *)((long)piVar18 + 10);
      iVar13 = ((uint)piVar18[1] >> 2) + 1;
      do {
        pSVar11 = FindScript(this,(int)(short)pWVar19[-1]);
        if (pSVar11 != (ScriptPtr *)0x0) {
          pSVar11->Flags = *pWVar19;
        }
        pWVar19 = pWVar19 + 2;
        iVar13 = iVar13 + -1;
      } while (1 < iVar13);
    }
    if (piVar16 != (int *)0x0) {
      for (piVar18 = piVar16; piVar18 < this->Data + this->DataSize;
          piVar18 = (int *)((long)piVar18 + (ulong)(piVar18[1] + 8))) {
        if (*piVar18 == 0x54435653) goto LAB_004d4cfc;
      }
    }
    piVar18 = (int *)0x0;
LAB_004d4cfc:
    if ((piVar18 != (int *)0x0) && (3 < (uint)piVar18[1])) {
      pWVar19 = (WORD *)((long)piVar18 + 10);
      iVar13 = ((uint)piVar18[1] >> 2) + 1;
      do {
        pSVar11 = FindScript(this,(int)(short)pWVar19[-1]);
        if (pSVar11 != (ScriptPtr *)0x0) {
          pSVar11->VarCount = *pWVar19;
        }
        pWVar19 = pWVar19 + 2;
        iVar13 = iVar13 + -1;
      } while (1 < iVar13);
    }
    if (piVar16 != (int *)0x0) {
      for (; piVar16 < this->Data + this->DataSize;
          piVar16 = (int *)((long)piVar16 + (ulong)(piVar16[1] + 8))) {
        if (*piVar16 == 0x59524153) goto joined_r0x004d4d6b;
      }
    }
    piVar16 = (int *)0x0;
joined_r0x004d4d6b:
    if (piVar16 != (int *)0x0) {
      if ((5 < piVar16[1]) &&
         (pSVar11 = FindScript(this,(int)(short)piVar16[2]), pSVar11 != (ScriptPtr *)0x0)) {
        iVar13 = ParseLocalArrayChunk(piVar16,&pSVar11->LocalArrays,(uint)pSVar11->VarCount);
        pSVar11->VarCount = (WORD)iVar13;
      }
      piVar18 = (int *)((ulong)(piVar16[1] + 8) + (long)piVar16);
      if (piVar18 < this->Data + this->DataSize) {
        iVar13 = *piVar16;
        do {
          piVar16 = piVar18;
          if (*piVar18 == iVar13) goto joined_r0x004d4d6b;
          piVar18 = (int *)((long)piVar18 + (ulong)(piVar18[1] + 8));
        } while (piVar18 < this->Data + this->DataSize);
      }
      piVar16 = (int *)0x0;
      goto joined_r0x004d4d6b;
    }
    piVar16 = (int *)this->Chunks;
    if (piVar16 != (int *)0x0) {
      for (; piVar16 < this->Data + this->DataSize;
          piVar16 = (int *)((long)piVar16 + (ulong)(piVar16[1] + 8))) {
        if (*piVar16 == 0x4d414e53) goto LAB_004d4e14;
      }
    }
    piVar16 = (int *)0x0;
LAB_004d4e14:
    if (piVar16 != (int *)0x0) {
      if (piVar16[2] != 0) {
        uVar17 = 0;
        do {
          lVar14 = uVar17 + 3;
          uVar17 = uVar17 + 1;
          strbin((char *)((long)piVar16 + (long)piVar16[lVar14] + 8));
        } while (uVar17 < (uint)piVar16[2]);
      }
      iVar13 = this->NumScripts;
      if (0 < iVar13) {
        lVar15 = 0;
        lVar14 = 0;
        do {
          iVar13 = *(int *)((long)&this->Scripts->Number + lVar15);
          if (iVar13 < 0) {
            iVar13 = FName::NameManager::FindName
                               (&FName::NameData,
                                (char *)((long)piVar16 + (ulong)(uint)piVar16[2 - iVar13] + 8),false
                               );
            *(int *)((long)&this->Scripts->Number + lVar15) = -iVar13;
          }
          lVar14 = lVar14 + 1;
          iVar13 = this->NumScripts;
          lVar15 = lVar15 + 0x38;
        } while (lVar14 < iVar13);
      }
      qsort(this->Scripts,(long)iVar13,0x38,SortScripts);
    }
  }
  return;
}

Assistant:

void FBehavior::LoadScriptsDirectory ()
{
	union
	{
		BYTE *b;
		DWORD *dw;
		WORD *w;
		SWORD *sw;
		ScriptPtr2 *po;		// Old
		ScriptPtr1 *pi;		// Intermediate
		ScriptPtr3 *pe;		// LittleEnhanced
	} scripts;
	int i, max;

	NumScripts = 0;
	Scripts = NULL;

	// Load the main script directory
	switch (Format)
	{
	case ACS_Old:
		scripts.dw = (DWORD *)(Data + LittleLong(((DWORD *)Data)[1]));
		NumScripts = LittleLong(scripts.dw[0]);
		if (NumScripts != 0)
		{
			scripts.dw++;

			Scripts = new ScriptPtr[NumScripts];

			for (i = 0; i < NumScripts; ++i)
			{
				ScriptPtr2 *ptr1 = &scripts.po[i];
				ScriptPtr  *ptr2 = &Scripts[i];

				ptr2->Number = LittleLong(ptr1->Number) % 1000;
				ptr2->Type = LittleLong(ptr1->Number) / 1000;
				ptr2->ArgCount = LittleLong(ptr1->ArgCount);
				ptr2->Address = LittleLong(ptr1->Address);
			}
		}
		break;

	case ACS_Enhanced:
	case ACS_LittleEnhanced:
		scripts.b = FindChunk (MAKE_ID('S','P','T','R'));
		if (scripts.b == NULL)
		{
			// There are no scripts!
		}
		else if (*(DWORD *)Data != MAKE_ID('A','C','S',0))
		{
			NumScripts = LittleLong(scripts.dw[1]) / 12;
			Scripts = new ScriptPtr[NumScripts];
			scripts.dw += 2;

			for (i = 0; i < NumScripts; ++i)
			{
				ScriptPtr1 *ptr1 = &scripts.pi[i];
				ScriptPtr  *ptr2 = &Scripts[i];

				ptr2->Number = LittleShort(ptr1->Number);
				ptr2->Type = BYTE(LittleShort(ptr1->Type));
				ptr2->ArgCount = LittleLong(ptr1->ArgCount);
				ptr2->Address = LittleLong(ptr1->Address);
			}
		}
		else
		{
			NumScripts = LittleLong(scripts.dw[1]) / 8;
			Scripts = new ScriptPtr[NumScripts];
			scripts.dw += 2;

			for (i = 0; i < NumScripts; ++i)
			{
				ScriptPtr3 *ptr1 = &scripts.pe[i];
				ScriptPtr  *ptr2 = &Scripts[i];

				ptr2->Number = LittleShort(ptr1->Number);
				ptr2->Type = ptr1->Type;
				ptr2->ArgCount = ptr1->ArgCount;
				ptr2->Address = LittleLong(ptr1->Address);
			}
		}
		break;

	default:
		break;
	}

// [EP] Clang 3.5.0 optimizer miscompiles this function and causes random
// crashes in the program. This is fixed in 3.5.1 onwards.
#if defined(__clang__) && __clang_major__ == 3 && __clang_minor__ == 5 && __clang_patchlevel__ == 0
	asm("" : "+g" (NumScripts));
#endif
	for (i = 0; i < NumScripts; ++i)
	{
		Scripts[i].Flags = 0;
		Scripts[i].VarCount = LOCAL_SIZE;
	}

	// Sort scripts, so we can use a binary search to find them
	if (NumScripts > 1)
	{
		qsort (Scripts, NumScripts, sizeof(ScriptPtr), SortScripts);
		// Check for duplicates because ACC originally did not enforce
		// script number uniqueness across different script types. We
		// only need to do this for old format lumps, because the ACCs
		// that produce new format lumps won't let you do this.
		if (Format == ACS_Old)
		{
			for (i = 0; i < NumScripts - 1; ++i)
			{
				if (Scripts[i].Number == Scripts[i+1].Number)
				{
					Printf(TEXTCOLOR_ORANGE "%s appears more than once.\n",
						ScriptPresentation(Scripts[i].Number).GetChars());
					// Make the closed version the first one.
					if (Scripts[i+1].Type == SCRIPT_Closed)
					{
						swapvalues(Scripts[i], Scripts[i+1]);
					}
				}
			}
		}
	}

	if (Format == ACS_Old)
		return;

	// Load script flags
	scripts.b = FindChunk (MAKE_ID('S','F','L','G'));
	if (scripts.dw != NULL)
	{
		max = LittleLong(scripts.dw[1]) / 4;
		scripts.dw += 2;
		for (i = max; i > 0; --i, scripts.w += 2)
		{
			ScriptPtr *ptr = const_cast<ScriptPtr *>(FindScript (LittleShort(scripts.sw[0])));
			if (ptr != NULL)
			{
				ptr->Flags = LittleShort(scripts.w[1]);
			}
		}
	}

	// Load script var counts. (Only recorded for scripts that use more than LOCAL_SIZE variables.)
	scripts.b = FindChunk (MAKE_ID('S','V','C','T'));
	if (scripts.dw != NULL)
	{
		max = LittleLong(scripts.dw[1]) / 4;
		scripts.dw += 2;
		for (i = max; i > 0; --i, scripts.w += 2)
		{
			ScriptPtr *ptr = const_cast<ScriptPtr *>(FindScript (LittleShort(scripts.sw[0])));
			if (ptr != NULL)
			{
				ptr->VarCount = LittleShort(scripts.w[1]);
			}
		}
	}

	// Load script array sizes. (One chunk per script that uses arrays.)
	for (scripts.b = FindChunk(MAKE_ID('S','A','R','Y')); scripts.dw != NULL; scripts.b = NextChunk(scripts.b))
	{
		int size = LittleLong(scripts.dw[1]);
		if (size >= 6)
		{
			int script_num = LittleShort(scripts.sw[4]);
			ScriptPtr *ptr = const_cast<ScriptPtr *>(FindScript(script_num));
			if (ptr != NULL)
			{
				ptr->VarCount = ParseLocalArrayChunk(scripts.b, &ptr->LocalArrays, ptr->VarCount);
			}
		}
	}

	// Load script names (if any)
	scripts.b = FindChunk(MAKE_ID('S','N','A','M'));
	if (scripts.dw != NULL)
	{
		UnescapeStringTable(scripts.b + 8, NULL, false);
		for (i = 0; i < NumScripts; ++i)
		{
			// ACC stores script names as an index into the SNAM chunk, with the first index as
			// -1 and counting down from there. We convert this from an index into SNAM into
			// a negative index into the global name table.
			if (Scripts[i].Number < 0)
			{
				const char *str = (const char *)(scripts.b + 8 + scripts.dw[3 + (-Scripts[i].Number - 1)]);
				FName name(str);
				Scripts[i].Number = -name;
			}
		}
		// We need to resort scripts, because the new numbers for named scripts likely
		// do not match the order they were originally in.
		qsort (Scripts, NumScripts, sizeof(ScriptPtr), SortScripts);
	}
}